

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_stream.h
# Opt level: O0

ssize_t __thiscall
crnlib::dynamic_stream::write(dynamic_stream *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  uint new_size;
  uint uVar2;
  uchar *__dest;
  undefined4 in_register_00000034;
  uint new_ofs;
  uint len_local;
  void *pBuf_local;
  dynamic_stream *this_local;
  
  this_local._4_4_ = (uint)__buf;
  if (((((this->super_data_stream).field_0x1a & 1) == 0) ||
      (bVar1 = data_stream::is_writable(&this->super_data_stream), !bVar1)) ||
     (this_local._4_4_ == 0)) {
    this_local._4_4_ = 0;
  }
  else {
    new_size = this->m_ofs + this_local._4_4_;
    uVar2 = vector<unsigned_char>::size(&this->m_buf);
    if (uVar2 < new_size) {
      vector<unsigned_char>::resize(&this->m_buf,new_size,false);
    }
    __dest = vector<unsigned_char>::operator[](&this->m_buf,this->m_ofs);
    memcpy(__dest,(void *)CONCAT44(in_register_00000034,__fd),(ulong)__buf & 0xffffffff);
    this->m_ofs = new_size;
  }
  return (ulong)this_local._4_4_;
}

Assistant:

virtual uint write(const void* pBuf, uint len)
        {
            CRNLIB_ASSERT(pBuf && (len <= 0x7FFFFFFF));

            if ((!m_opened) || (!is_writable()) || (!len))
            {
                return 0;
            }

            CRNLIB_ASSERT(m_ofs <= m_buf.size());

            uint new_ofs = m_ofs + len;
            if (new_ofs > m_buf.size())
            {
                m_buf.resize(new_ofs);
            }

            memcpy(&m_buf[m_ofs], pBuf, len);
            m_ofs = new_ofs;

            return len;
        }